

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.cpp
# Opt level: O0

bool arangodb::velocypack::Utf8Helper::isValidUtf8(uint8_t *p,ValueLength len)

{
  uint8_t state;
  uint8_t *end;
  ValueLength len_local;
  uint8_t *p_local;
  
  state = '\0';
  p_local = p;
  do {
    if (p + len <= p_local) {
      return state == '\0';
    }
    state = ::(anonymous_namespace)::states
            [(int)((uint)state * 0x10 + 0x100 +
                  (uint)(byte)::(anonymous_namespace)::states[*p_local])];
    p_local = p_local + 1;
  } while (state != '\x01');
  return false;
}

Assistant:

bool Utf8Helper::isValidUtf8(uint8_t const* p, ValueLength len) {
  uint8_t const* end = p + len;
  uint8_t state = ValidChar;

  while (p < end) {
    state = states[256 + state * 16 + states[*p++]];
    if (state == InvalidChar) {
      return false;
    }
  }

  return (state == ValidChar);
}